

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfCut.c
# Opt level: O0

Cnf_Cut_t * Cnf_CutAlloc(Cnf_Man_t *p,int nLeaves)

{
  int iVar1;
  Cnf_Cut_t *pCVar2;
  int nSize;
  Cnf_Cut_t *pCut;
  int nLeaves_local;
  Cnf_Man_t *p_local;
  
  iVar1 = Abc_TruthWordNum(nLeaves);
  pCVar2 = (Cnf_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCuts,nLeaves * 4 + 0x18 + iVar1 * 4);
  pCVar2->nFanins = (char)nLeaves;
  iVar1 = Abc_TruthWordNum(nLeaves);
  pCVar2->nWords = (short)iVar1;
  pCVar2->vIsop[1] = (Vec_Int_t *)0x0;
  pCVar2->vIsop[0] = (Vec_Int_t *)0x0;
  return pCVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates cut of the given size.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cnf_Cut_t * Cnf_CutAlloc( Cnf_Man_t * p, int nLeaves )
{
    Cnf_Cut_t * pCut;
    int nSize = sizeof(Cnf_Cut_t) + sizeof(int) * nLeaves + sizeof(unsigned) * Abc_TruthWordNum(nLeaves);
    pCut = (Cnf_Cut_t *)Aig_MmFlexEntryFetch( p->pMemCuts, nSize );
    pCut->nFanins = nLeaves;
    pCut->nWords = Abc_TruthWordNum(nLeaves);
    pCut->vIsop[0] = pCut->vIsop[1] = NULL;
    return pCut;
}